

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O3

void __thiscall MeCab::scoped_string::reset_string(scoped_string *this,string *str)

{
  char *pcVar1;
  char *__dest;
  
  __dest = (char *)operator_new__(str->_M_string_length + 1);
  strcpy(__dest,(str->_M_dataplus)._M_p);
  pcVar1 = (this->super_scoped_array<char>).ptr_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->super_scoped_array<char>).ptr_ = __dest;
  return;
}

Assistant:

void reset_string(const std::string &str) {
    char *p = new char[str.size() + 1];
    std::strcpy(p, str.c_str());
    reset(p);
  }